

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int StartThreadIM483Ix(IM483I *pIM483I)

{
  int iVar1;
  int iVar2;
  long lVar3;
  THREAD_IDENTIFIER *pThreadId;
  CRITICAL_SECTION *__mutex;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_2c;
  
  __mutex = IM483ICS;
  pThreadId = IM483IThreadId;
  lVar3 = 0;
  do {
    if (*(IM483I **)((long)addrsIM483I + lVar3 * 2) == pIM483I) {
      *(undefined4 *)((long)resIM483I + lVar3) = 1;
      *(undefined4 *)((long)bExitIM483I + lVar3) = 0;
      iVar1 = pthread_mutexattr_init(&local_2c);
      if (iVar1 == 0) {
        iVar1 = pthread_mutexattr_settype(&local_2c,1);
        if (iVar1 == 0) {
          iVar1 = pthread_mutex_init((pthread_mutex_t *)__mutex,&local_2c);
          iVar2 = pthread_mutexattr_destroy(&local_2c);
          if ((iVar1 == 0) && (iVar2 != 0)) {
            pthread_mutex_destroy((pthread_mutex_t *)__mutex);
          }
        }
        else {
          pthread_mutexattr_destroy(&local_2c);
        }
      }
      iVar1 = CreateDefaultThread(IM483IThread,pIM483I,pThreadId);
      return iVar1;
    }
    lVar3 = lVar3 + 4;
    __mutex = __mutex + 1;
    pThreadId = pThreadId + 1;
  } while (lVar3 != 0x40);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadIM483Ix(IM483I* pIM483I)
{
	int id = 0;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resIM483I[id] = EXIT_FAILURE;
	bExitIM483I[id] = FALSE;
	InitCriticalSection(&IM483ICS[id]);
	return CreateDefaultThread(IM483IThread, (void*)pIM483I, &IM483IThreadId[id]);
}